

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR eval_relative_location_path
                 (lyxp_expr *exp,uint32_t *tok_idx,ly_bool all_desc,lyxp_set *set,uint32_t options)

{
  ushort uVar1;
  lyxp_set_type lVar2;
  int iVar3;
  lyxp_set_node *plVar4;
  byte *pbVar5;
  long lVar6;
  uint32_t options_00;
  ly_path_predicate *predicates;
  lyxp_node_type lVar7;
  lyd_node *plVar8;
  ly_ctx *plVar9;
  LY_ERR ret___1;
  int iVar10;
  uint uVar11;
  LY_ERR LVar12;
  LY_ERR LVar13;
  char *pcVar14;
  lyxp_set *set_00;
  lyxp_set_scnode *plVar15;
  lys_module *plVar16;
  lysc_node *plVar17;
  lys_module *plVar18;
  lysc_node *plVar19;
  lysc_when *plVar20;
  char cVar21;
  long lVar22;
  lysc_node *plVar23;
  char *format;
  LY_ERR ret__;
  lyxp_axis axis;
  char *unaff_RBX;
  ulong uVar24;
  lyd_node *plVar25;
  undefined8 uVar26;
  lyxp_set_scnode *plVar27;
  ly_ctx *plVar28;
  undefined4 uVar29;
  char *pcVar30;
  undefined8 uVar31;
  char *pcVar32;
  lyd_meta *plVar33;
  lyxp_node_type lVar34;
  char *pcVar35;
  bool bVar36;
  char *pcVar37;
  char *pcVar38;
  lysc_node *local_160;
  uint32_t ncname_len;
  lyxp_expr *local_148;
  char *local_140;
  lys_module *moveto_mod;
  undefined8 local_130;
  char *ncname_dict;
  lys_module *local_120;
  char *local_118;
  char *ncname;
  lyd_node *sub;
  lyxp_node_type local_100;
  LY_VALUE_FORMAT local_fc;
  lyd_node *local_f8;
  lyd_node *local_f0;
  ly_path_predicate *local_e8;
  ulong local_e0;
  ly_ctx *local_d8;
  char *local_d0;
  lyxp_set result;
  
  local_d0 = "parsed";
  local_148 = exp;
  if (set == (lyxp_set *)0x0) {
    local_d0 = "skipped";
  }
  do {
    pcVar35 = "%-27s %s %s[%u]";
    uVar11 = *tok_idx;
    if (exp->tokens[uVar11] == LYXP_TOKEN_AT) {
      pcVar30 = "skipped";
      if ((options & 0x20) == 0) {
        pcVar30 = "parsed";
      }
      uVar26 = 2;
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar30,"@",
                 (ulong)exp->tok_pos[uVar11]);
LAB_001af15a:
      *tok_idx = *tok_idx + 1;
    }
    else {
      uVar26 = 3;
      if (exp->tokens[uVar11] == LYXP_TOKEN_AXISNAME) {
        if (exp->tok_len[uVar11] - 4 < 0xf) {
          pcVar30 = exp->expr + exp->tok_pos[uVar11];
          switch(exp->tok_len[uVar11]) {
          case 4:
            iVar10 = strncmp("self",pcVar30,4);
            uVar26 = 0xb;
            if (iVar10 != 0) {
              __assert_fail("!strncmp(\"self\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xaf,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            break;
          case 5:
            iVar10 = strncmp("child",pcVar30,5);
            uVar26 = 3;
            if (iVar10 != 0) {
              __assert_fail("!strncmp(\"child\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xb2,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            break;
          case 6:
            iVar10 = strncmp("parent",pcVar30,6);
            uVar26 = 8;
            if (iVar10 != 0) {
              __assert_fail("!strncmp(\"parent\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xb5,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            break;
          default:
            goto switchD_001aee85_caseD_7;
          case 8:
            iVar10 = strncmp("ancestor",pcVar30,8);
            uVar26 = 0;
            if (iVar10 != 0) {
              __assert_fail("!strncmp(\"ancestor\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xb8,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            break;
          case 9:
            if (*pcVar30 == 'f') {
              iVar10 = strncmp("following",pcVar30,9);
              uVar26 = 6;
              if (iVar10 != 0) {
                __assert_fail("!strncmp(\"following\", str, str_len)",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0xbf,"enum lyxp_axis str2axis(const char *, uint32_t)");
              }
            }
            else if (*pcVar30 == 'a') {
              iVar10 = strncmp("attribute",pcVar30,9);
              uVar26 = 2;
              if (iVar10 != 0) {
                __assert_fail("!strncmp(\"attribute\", str, str_len)",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0xbc,"enum lyxp_axis str2axis(const char *, uint32_t)");
              }
            }
            else {
              iVar10 = strncmp("preceding",pcVar30,9);
              uVar26 = 9;
              if (iVar10 != 0) {
                __assert_fail("!strncmp(\"preceding\", str, str_len)",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0xc2,"enum lyxp_axis str2axis(const char *, uint32_t)");
              }
            }
            break;
          case 10:
            iVar10 = strncmp("descendant",pcVar30,10);
            uVar26 = 4;
            if (iVar10 != 0) {
              __assert_fail("!strncmp(\"descendant\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,199,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            break;
          case 0x10:
            iVar10 = strncmp("ancestor-or-self",pcVar30,0x10);
            uVar26 = 1;
            if (iVar10 != 0) {
              __assert_fail("!strncmp(\"ancestor-or-self\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xca,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
            break;
          case 0x11:
            if (*pcVar30 == 'f') {
              iVar10 = strncmp("following-sibling",pcVar30,0x11);
              uVar26 = 7;
              if (iVar10 != 0) {
                __assert_fail("!strncmp(\"following-sibling\", str, str_len)",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0xce,"enum lyxp_axis str2axis(const char *, uint32_t)");
              }
            }
            else {
              iVar10 = strncmp("preceding-sibling",pcVar30,0x11);
              uVar26 = 10;
              if (iVar10 != 0) {
                __assert_fail("!strncmp(\"preceding-sibling\", str, str_len)",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0xd1,"enum lyxp_axis str2axis(const char *, uint32_t)");
              }
            }
            break;
          case 0x12:
            iVar10 = strncmp("descendant-or-self",pcVar30,0x12);
            uVar26 = 5;
            if (iVar10 != 0) {
              __assert_fail("!strncmp(\"descendant-or-self\", str, str_len)",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xd6,"enum lyxp_axis str2axis(const char *, uint32_t)");
            }
          }
        }
        else {
switchD_001aee85_caseD_7:
          uVar26 = 0;
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                 0xda);
        }
        unaff_RBX = "skipped";
        if ((options & 0x20) == 0) {
          unaff_RBX = "parsed";
        }
        pcVar30 = lyxp_token2str(exp->tokens[*tok_idx]);
        ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",unaff_RBX,pcVar30,
                   (ulong)exp->tok_pos[*tok_idx]);
        uVar11 = *tok_idx + 1;
        *tok_idx = uVar11;
        if (exp->tokens[uVar11] != LYXP_TOKEN_DCOLON) {
          __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_DCOLON",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x20d4,
                        "LY_ERR eval_relative_location_path(const struct lyxp_expr *, uint32_t *, ly_bool, struct lyxp_set *, uint32_t)"
                       );
        }
        ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",unaff_RBX,"::",
                   (ulong)exp->tok_pos[uVar11]);
        goto LAB_001af15a;
      }
    }
    uVar11 = *tok_idx;
    switch(exp->tokens[uVar11]) {
    case LYXP_TOKEN_DOT:
      pcVar35 = local_d0;
      if ((options & 0x20) == 0) {
        if ((options & 0x1c) == 0) {
          if (set->type != LYXP_SET_NODE_SET) goto LAB_001b0713;
        }
        else if (set->type != LYXP_SET_SCNODE_SET) {
LAB_001b0713:
          if ((ulong)set->type < 5) {
            uVar26 = *(undefined8 *)(&DAT_00204650 + (ulong)set->type * 8);
          }
          else {
            uVar26 = 0;
          }
          ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s.",
                  "path operator",uVar26);
          return LY_EVALID;
        }
        if ((all_desc != '\0') &&
           (LVar12 = xpath_pi_node(set,LYXP_AXIS_DESCENDANT_OR_SELF,options), LVar12 != LY_SUCCESS))
        {
          return LVar12;
        }
        LVar12 = xpath_pi_node(set,LYXP_AXIS_SELF,options);
        pcVar35 = local_d0;
LAB_001af590:
        if (LVar12 != LY_SUCCESS) {
          return LVar12;
        }
      }
      break;
    case LYXP_TOKEN_DDOT:
      pcVar35 = "skipped";
      if ((options & 0x20) == 0) {
        if ((options & 0x1c) == 0) {
          if (set->type != LYXP_SET_NODE_SET) goto LAB_001b0713;
        }
        else if (set->type != LYXP_SET_SCNODE_SET) goto LAB_001b0713;
        if ((all_desc != '\0') &&
           (LVar12 = xpath_pi_node(set,LYXP_AXIS_DESCENDANT_OR_SELF,options), LVar12 != LY_SUCCESS))
        {
          return LVar12;
        }
        LVar12 = xpath_pi_node(set,LYXP_AXIS_PARENT,options);
        pcVar35 = "parsed";
        goto LAB_001af590;
      }
      break;
    default:
      ly_log(set->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",0x2126
            );
      return LY_EINT;
    case LYXP_TOKEN_NAMETEST:
      ncname_dict = (char *)0x0;
      moveto_mod = (lys_module *)0x0;
      local_e8 = (ly_path_predicate *)0x0;
      pcVar30 = "parsed";
      if ((options & 0x20) != 0) {
        pcVar30 = "skipped";
      }
      local_130 = uVar26;
      pcVar14 = lyxp_token2str(exp->tokens[uVar11]);
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_name_test_with_predicate",pcVar30,pcVar14);
      uVar11 = *tok_idx;
      *tok_idx = uVar11 + 1;
      local_160 = (lysc_node *)0x0;
      if ((options & 0x20) == 0) {
        ncname = local_148->expr + local_148->tok_pos[uVar11];
        ncname_len = local_148->tok_len[uVar11];
        if (local_148->expr[local_148->tok_pos[uVar11]] == '*' && ncname_len == 1) {
LAB_001af354:
          local_160 = (lysc_node *)0x0;
          goto LAB_001af35a;
        }
        LVar12 = moveto_resolve_model(&ncname,&ncname_len,set,(lysc_node *)0x0,&moveto_mod);
        exp = local_148;
        if (LVar12 == LY_SUCCESS) {
          if ((*ncname == '*') && (ncname_len == 1)) goto LAB_001af354;
          if (all_desc == '\0') {
            if ((int)local_130 == 3) {
              local_160 = (lysc_node *)0x0;
              if (set->format == LY_VALUE_JSON || moveto_mod != (lys_module *)0x0) {
                if (set->type != LYXP_SET_NODE_SET) goto LAB_001af782;
                if (set->used == 0) {
LAB_001b012d:
                  local_160 = (lysc_node *)0x0;
                }
                else {
                  uVar24 = 0;
                  local_160 = (lysc_node *)0x0;
                  do {
                    plVar28 = set->ctx;
                    plVar25 = (set->val).nodes[uVar24].node;
                    local_118 = ncname;
                    local_140 = (char *)(ulong)ncname_len;
                    lVar34 = set->root_type;
                    local_fc = set->format;
                    result.type = LYXP_SET_NODE_SET;
                    local_120 = moveto_mod;
                    lVar7 = lVar34;
                    plVar8 = plVar25;
                    local_e0 = uVar24;
                    plVar9 = plVar28;
                    if (moveto_mod == (lys_module *)0x0 && local_fc != LY_VALUE_JSON) {
                      __assert_fail("(format == LY_VALUE_JSON) || moveto_mod",
                                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                                    ,0x1f3b,
                                    "LY_ERR eval_name_test_with_predicate_get_scnode(const struct ly_ctx *, const struct lyd_node *, const char *, uint32_t, const struct lys_module *, enum lyxp_node_type, LY_VALUE_FORMAT, const struct lysc_node **)"
                                   );
                    }
                    do {
                      local_d8 = plVar9;
                      local_f0 = plVar8;
                      local_100 = lVar7;
                      pcVar30 = local_140;
                      if (plVar25 == (lyd_node *)0x0) {
                        if ((local_fc == LY_VALUE_JSON) && (local_120 == (lys_module *)0x0)) {
                          do {
                            plVar18 = ly_ctx_get_module_iter(plVar28,&result.type);
                            if (plVar18 == (lys_module *)0x0) {
                              plVar17 = (lysc_node *)0x0;
                              break;
                            }
                          } while ((plVar18->implemented == '\0') ||
                                  (plVar17 = lys_find_child((lysc_node *)0x0,plVar18,local_118,
                                                            (size_t)local_140,0,0),
                                  plVar17 == (lysc_node *)0x0));
                          plVar25 = local_f0;
                          if (plVar17 == (lysc_node *)0x0) {
                            result.type = LYXP_SET_NODE_SET;
                            goto LAB_001b0017;
                          }
                        }
                        else {
                          plVar17 = lys_find_child((lysc_node *)0x0,local_120,local_118,
                                                   (size_t)local_140,0,0);
                          plVar25 = local_f0;
                        }
                      }
                      else if ((plVar25->schema == (lysc_node *)0x0) ||
                              ((local_160 != (lysc_node *)0x0 &&
                               (plVar17 = lysc_data_node(local_160->parent), plVar25 = local_f0,
                               plVar17 == local_f0->schema)))) {
LAB_001b0017:
                        plVar17 = (lysc_node *)0x0;
                      }
                      else {
                        pcVar14 = local_118;
                        pcVar35 = (char *)local_120;
                        if ((local_fc == LY_VALUE_JSON) && (local_120 == (lys_module *)0x0)) {
                          pcVar35 = (char *)plVar25->schema->module;
                        }
                        uVar1 = plVar25->schema->nodetype;
                        plVar17 = lys_find_child(plVar25->schema,(lys_module *)pcVar35,local_118,
                                                 (size_t)pcVar30,0,0);
                        plVar28 = local_d8;
                        lVar34 = local_100;
                        local_120 = (lys_module *)pcVar35;
                        if ((uVar1 & 0x300) != 0) {
                          plVar19 = lys_find_child(plVar25->schema,(lys_module *)pcVar35,pcVar14,
                                                   (size_t)pcVar30,0,0x10);
                          plVar23 = (lysc_node *)0x0;
                          if (plVar17 == (lysc_node *)0x0) {
                            plVar23 = plVar19;
                          }
                          plVar28 = local_d8;
                          lVar34 = local_100;
                          if (plVar19 != (lysc_node *)0x0) {
                            plVar17 = plVar23;
                          }
                        }
                      }
                      if (((lVar34 == LYXP_NODE_ROOT_CONFIG) && (plVar17 != (lysc_node *)0x0)) &&
                         ((plVar17->flags & 2) != 0)) {
                        plVar17 = (lysc_node *)0x0;
                      }
                      plVar23 = local_160;
                      if ((plVar17 != (lysc_node *)0x0) &&
                         (plVar23 = plVar17, local_160 != (lysc_node *)0x0)) {
                        bVar36 = false;
                        goto LAB_001b00d7;
                      }
                      local_160 = plVar23;
                      lVar7 = local_100;
                      plVar8 = local_f0;
                      plVar9 = local_d8;
                    } while (result.type != LYXP_SET_NODE_SET);
                    bVar36 = true;
LAB_001b00d7:
                    if (!bVar36) goto LAB_001b012d;
                    uVar24 = local_e0 + 1;
                  } while (uVar24 < set->used);
                }
                if (((local_160 != (lysc_node *)0x0) && ((local_160->nodetype & 0x18) != 0)) &&
                   (LVar12 = eval_name_test_try_compile_predicates
                                       (exp,tok_idx,local_160,set,&local_e8), LVar12 != LY_SUCCESS))
                {
                  local_160 = (lysc_node *)0x0;
                }
              }
            }
            else {
LAB_001af782:
              local_160 = (lysc_node *)0x0;
            }
          }
          else {
            local_160 = (lysc_node *)0x0;
          }
          if ((local_160 != (lysc_node *)0x0) ||
             (LVar12 = lydict_insert(set->ctx,ncname,(ulong)ncname_len,&ncname_dict),
             LVar12 == LY_SUCCESS)) goto LAB_001af35a;
        }
        else {
          local_160 = (lysc_node *)0x0;
        }
LAB_001b05ec:
        lydict_remove(set->ctx,ncname_dict);
        if (local_e8 != (ly_path_predicate *)0x0) {
          ly_path_predicates_free(local_160->module->ctx,local_e8);
        }
      }
      else {
LAB_001af35a:
        predicates = local_e8;
        pcVar30 = ncname_dict;
        plVar18 = moveto_mod;
        exp = local_148;
        bVar36 = (options & 0x1c) == 0;
        cVar21 = (char)((options & 0x20) >> 5);
        axis = (lyxp_axis)local_130;
        if (axis == LYXP_AXIS_ATTRIBUTE) {
          if (bVar36 || cVar21 != '\0') {
            if (all_desc == '\0') {
              LVar12 = LY_SUCCESS;
              if ((options & 0x20) == 0) {
                lVar22 = (long)(int)set->type;
                if (lVar22 != 0) goto LAB_001af7ad;
                if (set->used != 0) {
                  uVar24 = 0;
                  do {
                    bVar36 = true;
                    if (((set->val).nodes[uVar24].type == LYXP_NODE_ELEM) &&
                       (plVar33 = ((set->val).nodes[uVar24].node)->meta, plVar33 != (lyd_meta *)0x0)
                       ) {
                      bVar36 = false;
                      do {
                        if (((plVar18 == (lys_module *)0x0) ||
                            (plVar33->annotation->module == plVar18)) &&
                           ((pcVar30 == (char *)0x0 || (plVar33->name == pcVar30)))) {
                          if (bVar36) {
                            set_insert_node(set,(lyd_node *)plVar33,(set->val).nodes[uVar24].pos,
                                            LYXP_NODE_META,(int)uVar24 + 1);
                          }
                          else {
                            (set->val).nodes[uVar24].node = (lyd_node *)plVar33;
                            (set->val).nodes[uVar24].type = LYXP_NODE_META;
                          }
                          uVar24 = (ulong)((int)uVar24 + 1);
                          bVar36 = true;
                        }
                        plVar33 = plVar33->next;
                      } while (plVar33 != (lyd_meta *)0x0);
                      bVar36 = !bVar36;
                    }
                    if (bVar36) {
                      set_remove_node(set,(uint)uVar24);
                    }
                  } while ((uint)uVar24 < set->used);
                  LVar12 = LY_SUCCESS;
                }
              }
            }
            else {
              LVar12 = LY_SUCCESS;
              if ((options & 0x20) == 0) {
                lVar22 = (long)(int)set->type;
                if (lVar22 == 0) {
                  set_00 = set_copy(set);
                  LVar12 = moveto_node_alldesc_child(set_00,(lys_module *)0x0,(char *)0x0,options);
                  if (LVar12 == LY_SUCCESS) {
                    LVar12 = moveto_union(set,set_00);
                    if (LVar12 == LY_SUCCESS) {
                      if (set_00 != (lyxp_set *)0x0) {
                        lyxp_set_free_content(set_00);
                        free(set_00);
                      }
                      LVar12 = LY_SUCCESS;
                      if (set->used != 0) {
                        uVar24 = 0;
                        do {
                          bVar36 = true;
                          if (((set->val).nodes[uVar24].type == LYXP_NODE_ELEM) &&
                             (plVar33 = ((set->val).nodes[uVar24].node)->meta,
                             plVar33 != (lyd_meta *)0x0)) {
                            bVar36 = false;
                            do {
                              if (((plVar18 == (lys_module *)0x0) ||
                                  (plVar33->annotation->module == plVar18)) &&
                                 ((pcVar30 == (char *)0x0 || (plVar33->name == pcVar30)))) {
                                if (bVar36) {
                                  set_insert_node(set,(lyd_node *)plVar33,
                                                  (set->val).nodes[uVar24].pos,LYXP_NODE_META,
                                                  (int)uVar24 + 1);
                                }
                                else {
                                  (set->val).nodes[uVar24].node = (lyd_node *)plVar33;
                                  (set->val).nodes[uVar24].type = LYXP_NODE_META;
                                }
                                uVar24 = (ulong)((int)uVar24 + 1);
                                bVar36 = true;
                              }
                              plVar33 = plVar33->next;
                            } while (plVar33 != (lyd_meta *)0x0);
                            bVar36 = !bVar36;
                          }
                          if (bVar36) {
                            set_remove_node(set,(uint)uVar24);
                          }
                          LVar12 = LY_SUCCESS;
                        } while ((uint)uVar24 < set->used);
                      }
                    }
                    else if (set_00 != (lyxp_set *)0x0) {
                      lyxp_set_free_content(set_00);
                      free(set_00);
                    }
                  }
                  else if (set_00 != (lyxp_set *)0x0) {
                    lyxp_set_free_content(set_00);
                    free(set_00);
                  }
                }
                else {
LAB_001af7ad:
                  if ((uint)lVar22 < 5) {
                    uVar26 = *(undefined8 *)(&DAT_00204698 + lVar22 * 8);
                  }
                  else {
                    uVar26 = 0;
                  }
                  ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s.",
                          "path operator",uVar26);
                  LVar12 = LY_EVALID;
                }
              }
            }
            goto joined_r0x001afa8d;
          }
          uVar11 = set->used;
          if ((ulong)uVar11 != 0) {
            lVar22 = 0;
            do {
              iVar10 = *(int *)((long)&((set->val).nodes)->pos + lVar22);
              if (iVar10 == 2) {
                uVar29 = 0;
LAB_001af4c4:
                *(undefined4 *)((long)&((set->val).nodes)->pos + lVar22) = uVar29;
              }
              else if (iVar10 == -2) {
                uVar29 = 0xffffffff;
                goto LAB_001af4c4;
              }
              lVar22 = lVar22 + 0x18;
            } while ((ulong)uVar11 * 0x18 != lVar22);
          }
LAB_001b0597:
          bVar36 = false;
          LVar13 = LY_SUCCESS;
LAB_001b059b:
          exp = local_148;
          options_00 = options | 0x20;
          if (!bVar36) {
            options_00 = options;
          }
          do {
            LVar12 = LVar13;
            if ((exp->used == *tok_idx) || (exp->tokens[*tok_idx] != LYXP_TOKEN_BRACK1)) break;
            LVar12 = eval_predicate(exp,tok_idx,set,options_00,(lyxp_axis)local_130);
          } while (LVar12 == LY_SUCCESS);
          goto LAB_001b05ec;
        }
        if (bVar36 || cVar21 != '\0') {
          if (axis == LYXP_AXIS_CHILD && all_desc != '\0') {
            LVar12 = moveto_node_alldesc_child(set,moveto_mod,ncname_dict,options);
          }
          else if ((axis == LYXP_AXIS_CHILD) && (local_160 != (lysc_node *)0x0)) {
            local_f8 = (lyd_node *)0x0;
            uVar1 = local_160->nodetype;
            if ((local_e8 == (ly_path_predicate *)0x0) && ((uVar1 & 0x18) != 0)) {
              __assert_fail("scnode && (!(scnode->nodetype & (LYS_LIST | LYS_LEAFLIST)) || predicates)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0x1846,
                            "LY_ERR moveto_node_hash_child(struct lyxp_set *, const struct lysc_node *, const struct ly_path_predicate *, uint32_t)"
                           );
            }
            memset(&result,0,0x90);
            if (set != (lyxp_set *)0x0) {
              result.non_child_axis = set->non_child_axis;
              result.not_found = set->not_found;
              result.ctx = set->ctx;
              result.field_10 = set->field_10;
              result.root_type = set->root_type;
              result.context_op = set->context_op;
              result.tree = set->tree;
              result.cur_mod = set->cur_mod;
              result.format = set->format;
              result.prefix_data = set->prefix_data;
              result.vars = set->vars;
            }
            LVar12 = LY_SUCCESS;
            if ((options & 0x20) == 0) {
              lVar2 = set->type;
              if ((long)(int)lVar2 == 0) {
                if (((set->root_type == LYXP_NODE_ROOT_CONFIG) && ((local_160->flags & 2) != 0)) ||
                   ((set->context_op != (lysc_node *)0x0 &&
                    (set->context_op != local_160 && (uVar1 & 0x700) != 0)))) {
                  lyxp_set_free_content(set);
                }
                else {
                  if (uVar1 == 8) {
                    LVar12 = lyd_create_term2(local_160,&(predicates->field_1).field_1.field_1.value
                                              ,&local_f8);
LAB_001b03dd:
                    if (LVar12 != LY_SUCCESS) goto LAB_001b0568;
                  }
                  else if (uVar1 == 0x10) {
                    LVar12 = lyd_create_list(local_160,predicates,(lyxp_var *)0x0,'\x01',&local_f8);
                    goto LAB_001b03dd;
                  }
                  if (set->used != 0) {
                    lVar22 = 0;
                    uVar24 = 0;
                    do {
                      plVar4 = (set->val).nodes;
                      iVar10 = *(int *)((long)&plVar4->type + lVar22);
                      if (iVar10 - 1U < 2) {
                        if (*(long *)((long)&plVar4->node + lVar22) != 0) {
                          __assert_fail("!set->val.nodes[i].node",
                                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                                        ,0x186a,
                                        "LY_ERR moveto_node_hash_child(struct lyxp_set *, const struct lysc_node *, const struct ly_path_predicate *, uint32_t)"
                                       );
                        }
                        plVar25 = set->tree;
                      }
                      else if (((iVar10 == 3) &&
                               (lVar6 = *(long *)((long)&plVar4->node + lVar22), lVar6 != 0)) &&
                              ((*(ushort **)(lVar6 + 8) == (ushort *)0x0 ||
                               ((**(ushort **)(lVar6 + 8) & 0x711) != 0)))) {
                        plVar25 = *(lyd_node **)(lVar6 + 0x38);
                      }
                      else {
                        plVar25 = (lyd_node *)0x0;
                      }
                      if (local_f8 == (lyd_node *)0x0) {
                        LVar12 = lyd_find_sibling_val(plVar25,local_160,(char *)0x0,0,&sub);
                      }
                      else {
                        LVar12 = lyd_find_sibling_first(plVar25,local_f8,&sub);
                      }
                      if (LVar12 == LY_ENOTFOUND) {
                        LVar12 = lyd_find_sibling_opaq_next(plVar25,local_160->name,&sub);
                      }
                      if ((LVar12 != LY_ENOTFOUND) && (LVar12 != LY_SUCCESS)) goto LAB_001b0568;
                      if ((sub != (lyd_node *)0x0 && (options & 1) == 0) &&
                         ((plVar20 = lysc_has_when(sub->schema), plVar20 != (lysc_when *)0x0 &&
                          ((sub->flags & 2) == 0)))) {
                        LVar12 = LY_EINCOMPLETE;
                        goto LAB_001b0568;
                      }
                      if (sub != (lyd_node *)0x0) {
                        set_insert_node(&result,sub,0,LYXP_NODE_ELEM,result.used);
                      }
                      uVar24 = uVar24 + 1;
                      lVar22 = lVar22 + 0x10;
                    } while (uVar24 < set->used);
                  }
                  lyxp_set_free_content(set);
                  memcpy(set,&result,0x90);
                  result.type = LYXP_SET_NUMBER;
                  iVar10 = set_sort(set);
                  LVar12 = LY_SUCCESS;
                  if (iVar10 != 0) {
                    __assert_fail("!set_sort(set)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                                  ,0x188f,
                                  "LY_ERR moveto_node_hash_child(struct lyxp_set *, const struct lysc_node *, const struct ly_path_predicate *, uint32_t)"
                                 );
                  }
                }
              }
              else {
                if (lVar2 < (LYXP_SET_STRING|LYXP_SET_SCNODE_SET)) {
                  uVar26 = *(undefined8 *)(&DAT_00204698 + (long)(int)lVar2 * 8);
                }
                else {
                  uVar26 = 0;
                }
                ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s.",
                        "path operator",uVar26);
                LVar12 = LY_EVALID;
              }
            }
LAB_001b0568:
            lyxp_set_free_content(&result);
            lyd_free_tree(local_f8);
          }
          else {
            if ((all_desc != '\0') &&
               (LVar12 = xpath_pi_node(set,LYXP_AXIS_DESCENDANT_OR_SELF,options),
               LVar12 != LY_SUCCESS)) goto LAB_001b05ec;
            LVar12 = moveto_node(set,moveto_mod,ncname_dict,axis,options);
          }
joined_r0x001afa8d:
          if (LVar12 != LY_SUCCESS) goto LAB_001b05ec;
          goto LAB_001b0597;
        }
        pcVar30 = (char *)(ulong)set->used;
        if (pcVar30 == (char *)0x0) {
          plVar27 = (lyxp_set_scnode *)0x0;
        }
        else {
          plVar15 = (set->val).scnodes;
          plVar27 = (lyxp_set_scnode *)0x0;
          pcVar14 = pcVar30;
          do {
            if ((plVar15->in_ctx == 2) &&
               (bVar36 = plVar27 != (lyxp_set_scnode *)0x0, plVar27 = plVar15, bVar36)) {
              plVar27 = (lyxp_set_scnode *)0x0;
              break;
            }
            plVar15 = plVar15 + 1;
            pcVar14 = pcVar14 + -1;
          } while (pcVar14 != (char *)0x0);
        }
        if (axis == LYXP_AXIS_CHILD && all_desc != '\0') {
          if ((options & 0x20) == 0) {
            lVar2 = set->type;
            if ((ulong)lVar2 != 1) {
              if (lVar2 < (LYXP_SET_STRING|LYXP_SET_SCNODE_SET)) {
                uVar26 = *(undefined8 *)(&DAT_00204678 + (ulong)lVar2 * 8);
              }
              else {
                uVar26 = 0;
              }
              ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s.",
                      "path operator",uVar26);
              LVar12 = LY_EVALID;
              goto LAB_001afd0b;
            }
            if (pcVar30 != (char *)0x0) {
              local_140 = ncname_dict;
              pcVar14 = (char *)0x0;
              local_118 = pcVar30;
              do {
                iVar10 = *(int *)((long)(set->val).nodes + (long)pcVar14 * 0x18 + 0xc);
                if (iVar10 == -2) {
                  uVar29 = 0xffffffff;
LAB_001af93b:
                  *(undefined4 *)((long)(set->val).nodes + (long)pcVar14 * 0x18 + 0xc) = uVar29;
                  iVar10 = *(int *)((long)(set->val).nodes + (long)pcVar14 * 0x18 + 8);
                  if (iVar10 - 1U < 2) {
                    result.type = LYXP_SET_NODE_SET;
                    while (plVar16 = ly_ctx_get_module_iter(set->ctx,&result.type),
                          plVar16 != (lys_module *)0x0) {
                      if (plVar16->compiled != (lysc_module *)0x0) {
                        plVar17 = (lysc_node *)0x0;
                        while (plVar17 = lys_getnext(plVar17,(lysc_node *)0x0,plVar16->compiled,0),
                              plVar17 != (lysc_node *)0x0) {
                          LVar13 = moveto_scnode_dfs(set,plVar17,(uint32_t)pcVar14,plVar18,local_140
                                                     ,options);
                          pcVar35 = (char *)((ulong)pcVar35 & 0xffffffff);
                          if (LVar13 != LY_SUCCESS) {
                            pcVar35 = (char *)0x1;
                          }
                          LVar12 = (LY_ERR)pcVar35;
                          if (LVar13 != LY_SUCCESS) goto LAB_001afd0b;
                        }
                      }
                    }
                  }
                  else if (iVar10 == 3) {
                    LVar13 = moveto_scnode_dfs(set,*(lysc_node **)
                                                    ((long)(set->val).nodes + (long)pcVar14 * 0x18),
                                               (uint32_t)pcVar14,plVar18,local_140,options);
                    pcVar35 = (char *)((ulong)pcVar35 & 0xffffffff);
                    if (LVar13 != LY_SUCCESS) {
                      pcVar35 = (char *)(ulong)LVar13;
                    }
                    LVar12 = (LY_ERR)pcVar35;
                    if (LVar13 != LY_SUCCESS) goto LAB_001afd0b;
                  }
                }
                else if (iVar10 == 2) {
                  uVar29 = 0;
                  goto LAB_001af93b;
                }
                pcVar14 = pcVar14 + 1;
              } while (pcVar14 != local_118);
            }
          }
          LVar12 = LY_SUCCESS;
LAB_001afd0b:
          pcVar35 = ncname;
          if (LVar12 != LY_SUCCESS) goto LAB_001afd10;
          uVar11 = set->used;
          do {
            uVar11 = uVar11 - 1;
            iVar3 = *(int *)((long)(set->val).nodes + (ulong)uVar11 * 0x18 + 0xc);
            if (uVar11 == 0) break;
          } while (iVar3 < 1);
          iVar10 = 0;
          if (0 < iVar3) {
            LVar12 = LY_SUCCESS;
            iVar10 = 0;
            goto LAB_001afd43;
          }
          local_140 = (char *)(ulong)ncname_len;
          pcVar30 = exp->expr;
          pcVar14 = lysc_path((set->field_10).cur_scnode,LYSC_PATH_LOG,(char *)0x0,0);
          pcVar32 = (char *)0x0;
          if (plVar27 != (lyxp_set_scnode *)0x0) {
            lVar34 = plVar27->type;
            if (lVar34 == LYXP_NODE_ROOT) {
              pcVar32 = "<root>";
            }
            else {
              if (lVar34 != LYXP_NODE_ROOT_CONFIG) {
                if (lVar34 == LYXP_NODE_ELEM) {
                  pcVar32 = lysc_path(plVar27->scnode,LYSC_PATH_LOG,(char *)0x0,0);
                }
                else {
                  pcVar32 = (char *)0x0;
                }
                goto LAB_001b01da;
              }
              pcVar32 = "<config-root>";
            }
            pcVar32 = strdup(pcVar32);
          }
LAB_001b01da:
          if (pcVar32 == (char *)0x0) {
            bVar36 = (options & 0x40) != 0;
            if (bVar36) {
              plVar28 = set->ctx;
              LVar12 = LY_ENOTFOUND;
            }
            else {
              plVar28 = set->ctx;
              LVar12 = LY_SUCCESS;
            }
            format = "Schema node \"%.*s\" not found; in expr \"%.*s\" with context node \"%s\".";
            pcVar37 = local_140 + (long)pcVar35 + -(long)pcVar30;
            pcVar38 = pcVar30;
            pcVar30 = pcVar14;
          }
          else {
            bVar36 = (options & 0x40) != 0;
            if (bVar36) {
              plVar28 = set->ctx;
              LVar12 = LY_ENOTFOUND;
            }
            else {
              plVar28 = set->ctx;
              LVar12 = LY_SUCCESS;
            }
            format = 
            "Schema node \"%.*s\" for parent \"%s\" not found; in expr \"%.*s\" with context node \"%s\"."
            ;
            pcVar37 = pcVar32;
            pcVar38 = local_140 + (long)pcVar35 + -(long)pcVar30;
          }
          ly_log(plVar28,(uint)!bVar36,LVar12,format,local_140,pcVar35,pcVar37,pcVar38,pcVar30);
          free(pcVar14);
          free(pcVar32);
          bVar36 = true;
          LVar12 = LY_ENOT;
          if ((options & 0x40) != 0) {
            set->not_found = '\x01';
          }
        }
        else {
          if ((all_desc == '\0') ||
             (LVar12 = xpath_pi_node(set,LYXP_AXIS_DESCENDANT_OR_SELF,options), LVar12 == LY_SUCCESS
             )) {
            LVar12 = moveto_scnode(set,moveto_mod,ncname_dict,(lyxp_axis)local_130,options);
            goto LAB_001afd0b;
          }
LAB_001afd10:
          iVar10 = 3;
LAB_001afd43:
          bVar36 = false;
        }
        LVar13 = LVar12;
        if (iVar10 == 0) goto LAB_001b059b;
        if (iVar10 == 3) goto LAB_001b05ec;
      }
      if (LVar12 == LY_ENOT) {
        if ((options & 0x1c) == 0) {
          __assert_fail("options & LYXP_SCNODE_ALL",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x2115,
                        "LY_ERR eval_relative_location_path(const struct lyxp_expr *, uint32_t *, ly_bool, struct lyxp_set *, uint32_t)"
                       );
        }
        options = options | 0x20;
        LVar12 = LY_SUCCESS;
      }
      goto joined_r0x001afc0e;
    case LYXP_TOKEN_NODETYPE:
      pcVar35 = "skipped";
      if ((options & 0x20) == 0) {
        if (exp->tok_len[uVar11] != 4) {
          __assert_fail("exp->tok_len[*tok_idx] == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x2086,
                        "LY_ERR eval_node_type_with_predicate(const struct lyxp_expr *, uint32_t *, enum lyxp_axis, ly_bool, struct lyxp_set *, uint32_t)"
                       );
        }
        uVar11 = exp->tok_pos[uVar11];
        pcVar35 = exp->expr;
        iVar10 = strncmp(pcVar35 + uVar11,"node",4);
        if (iVar10 == 0) {
          LVar12 = xpath_pi_node(set,(lyxp_axis)uVar26,options);
          unaff_RBX = (char *)(ulong)LVar12;
        }
        else {
          iVar10 = strncmp(pcVar35 + uVar11,"text",4);
          if (iVar10 != 0) {
            __assert_fail("!strncmp(&exp->expr[exp->tok_pos[*tok_idx]], \"text\", 4)",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                          ,0x208a,
                          "LY_ERR eval_node_type_with_predicate(const struct lyxp_expr *, uint32_t *, enum lyxp_axis, ly_bool, struct lyxp_set *, uint32_t)"
                         );
          }
          if ((options & 0x1c) == 0) {
            lVar2 = set->type;
            if ((long)(int)lVar2 == 0) {
              if ((lyxp_axis)uVar26 == LYXP_AXIS_CHILD) {
                if (set->used != 0) {
                  lVar22 = 8;
                  uVar24 = 0;
                  do {
                    plVar4 = (set->val).nodes;
                    uVar11 = *(uint *)((long)&plVar4->node + lVar22);
                    if (uVar11 < 6) {
                      if ((0x36U >> (uVar11 & 0x1f) & 1) == 0) {
                        if (uVar11 != 3) {
                          unaff_RBX = (char *)0x6;
                          ly_log(set->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                                 ,0x1601);
                          goto LAB_001afaf6;
                        }
                        pbVar5 = *(byte **)(*(long *)((long)plVar4 + lVar22 + -8) + 8);
                        if ((pbVar5 == (byte *)0x0) || ((*pbVar5 & 0xc) != 0)) {
                          *(undefined4 *)((long)&plVar4->node + lVar22) = 4;
                          goto LAB_001af83b;
                        }
                      }
                      set_remove_node_none(set,(uint32_t)uVar24);
                    }
LAB_001af83b:
                    uVar24 = uVar24 + 1;
                    lVar22 = lVar22 + 0x10;
                  } while (uVar24 < set->used);
                }
                set_remove_nodes_none(set);
              }
              else {
                lyxp_set_free_content(set);
              }
              unaff_RBX = (char *)0x0;
            }
            else {
              if (lVar2 < (LYXP_SET_STRING|LYXP_SET_SCNODE_SET)) {
                uVar31 = *(undefined8 *)(&DAT_00204698 + (long)(int)lVar2 * 8);
              }
              else {
                uVar31 = 0;
              }
              ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,"Invalid context type %s in %s.",uVar31,
                      "text()");
              unaff_RBX = (char *)0x7;
            }
          }
          else {
            uVar11 = set->used;
            unaff_RBX = (char *)0x0;
            if ((ulong)uVar11 != 0) {
              lVar22 = 0;
              do {
                iVar10 = *(int *)((long)&((set->val).nodes)->pos + lVar22);
                if (iVar10 == 2) {
                  uVar29 = 1;
LAB_001af293:
                  *(undefined4 *)((long)&((set->val).nodes)->pos + lVar22) = uVar29;
                }
                else if (iVar10 == -2) {
                  uVar29 = 0xffffffff;
                  goto LAB_001af293;
                }
                lVar22 = lVar22 + 0x18;
              } while ((ulong)uVar11 * 0x18 != lVar22);
            }
          }
        }
LAB_001afaf6:
        pcVar35 = "parsed";
        LVar12 = (LY_ERR)unaff_RBX;
        if ((LY_ERR)unaff_RBX == LY_SUCCESS) goto LAB_001afb08;
      }
      else {
LAB_001afb08:
        local_130 = uVar26;
        pcVar30 = lyxp_token2str(exp->tokens[*tok_idx]);
        ly_log_dbg(2,"%-27s %s %s[%u]","eval_node_type_with_predicate",pcVar35,pcVar30,
                   (ulong)exp->tok_pos[*tok_idx]);
        uVar11 = *tok_idx + 1;
        *tok_idx = uVar11;
        if (exp->tokens[uVar11] != LYXP_TOKEN_PAR1) {
          __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_PAR1",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x2094,
                        "LY_ERR eval_node_type_with_predicate(const struct lyxp_expr *, uint32_t *, enum lyxp_axis, ly_bool, struct lyxp_set *, uint32_t)"
                       );
        }
        ly_log_dbg(2,"%-27s %s %s[%u]","eval_node_type_with_predicate",pcVar35,"(",
                   (ulong)exp->tok_pos[uVar11]);
        uVar11 = *tok_idx + 1;
        *tok_idx = uVar11;
        if (exp->tokens[uVar11] != LYXP_TOKEN_PAR2) {
          __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_PAR2",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x209a,
                        "LY_ERR eval_node_type_with_predicate(const struct lyxp_expr *, uint32_t *, enum lyxp_axis, ly_bool, struct lyxp_set *, uint32_t)"
                       );
        }
        ly_log_dbg(2,"%-27s %s %s[%u]","eval_node_type_with_predicate",pcVar35,")",
                   (ulong)exp->tok_pos[uVar11]);
        uVar26 = local_130;
        *tok_idx = *tok_idx + 1;
        do {
          LVar12 = LY_SUCCESS;
          if ((exp->used == *tok_idx) ||
             (LVar12 = LY_SUCCESS, exp->tokens[*tok_idx] != LYXP_TOKEN_BRACK1)) break;
          LVar13 = eval_predicate(exp,tok_idx,set,options,(lyxp_axis)uVar26);
          unaff_RBX = (char *)((ulong)unaff_RBX & 0xffffffff);
          if (LVar13 != LY_SUCCESS) {
            unaff_RBX = (char *)(ulong)LVar13;
          }
          LVar12 = (LY_ERR)unaff_RBX;
        } while (LVar13 == LY_SUCCESS);
      }
joined_r0x001afc0e:
      if (LVar12 != LY_SUCCESS) {
        return LVar12;
      }
      goto LAB_001b0637;
    }
    pcVar30 = lyxp_token2str(exp->tokens[*tok_idx]);
    ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar35,pcVar30,
               (ulong)exp->tok_pos[*tok_idx]);
    *tok_idx = *tok_idx + 1;
LAB_001b0637:
    uVar11 = *tok_idx;
    if ((exp->used == uVar11) || ((exp->tokens[uVar11] & ~LYXP_TOKEN_PAR1) != LYXP_TOKEN_OPER_PATH))
    {
      return LY_SUCCESS;
    }
    if (exp->tok_len[uVar11] == 1) {
      all_desc = '\0';
    }
    else {
      if (exp->tok_len[uVar11] != 2) {
        __assert_fail("exp->tok_len[*tok_idx] == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x20c4,
                      "LY_ERR eval_relative_location_path(const struct lyxp_expr *, uint32_t *, ly_bool, struct lyxp_set *, uint32_t)"
                     );
      }
      all_desc = '\x01';
    }
    unaff_RBX = "skipped";
    if ((options & 0x20) == 0) {
      unaff_RBX = "parsed";
    }
    pcVar35 = lyxp_token2str(exp->tokens[uVar11]);
    ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",unaff_RBX,pcVar35,
               (ulong)exp->tok_pos[*tok_idx]);
    *tok_idx = *tok_idx + 1;
  } while( true );
}

Assistant:

static LY_ERR
eval_relative_location_path(const struct lyxp_expr *exp, uint32_t *tok_idx, ly_bool all_desc, struct lyxp_set *set,
        uint32_t options)
{
    LY_ERR rc = LY_SUCCESS;
    enum lyxp_axis axis;
    int scnode_skip_path = 0;

    goto step;
    do {
        /* evaluate '/' or '//' */
        if (exp->tok_len[*tok_idx] == 1) {
            all_desc = 0;
        } else {
            assert(exp->tok_len[*tok_idx] == 2);
            all_desc = 1;
        }
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
        ++(*tok_idx);

step:
        /* AxisSpecifier */
        if (exp->tokens[*tok_idx] == LYXP_TOKEN_AXISNAME) {
            axis = str2axis(exp->expr + exp->tok_pos[*tok_idx], exp->tok_len[*tok_idx]);

            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);

            assert(exp->tokens[*tok_idx] == LYXP_TOKEN_DCOLON);
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);
        } else if (exp->tokens[*tok_idx] == LYXP_TOKEN_AT) {
            axis = LYXP_AXIS_ATTRIBUTE;

            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);
        } else {
            /* default */
            axis = LYXP_AXIS_CHILD;
        }

        /* NodeTest Predicate* */
        switch (exp->tokens[*tok_idx]) {
        case LYXP_TOKEN_DOT:
            /* evaluate '.' */
            if (!(options & LYXP_SKIP_EXPR)) {
                if (((options & LYXP_SCNODE_ALL) && (set->type != LYXP_SET_SCNODE_SET)) ||
                        (!(options & LYXP_SCNODE_ALL) && (set->type != LYXP_SET_NODE_SET))) {
                    LOGVAL(set->ctx, LY_VCODE_XP_INOP_1, "path operator", print_set_type(set));
                    rc = LY_EVALID;
                    goto cleanup;
                }

                if (all_desc) {
                    rc = xpath_pi_node(set, LYXP_AXIS_DESCENDANT_OR_SELF, options);
                    LY_CHECK_GOTO(rc, cleanup);
                }
                rc = xpath_pi_node(set, LYXP_AXIS_SELF, options);
                LY_CHECK_GOTO(rc, cleanup);
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);
            break;

        case LYXP_TOKEN_DDOT:
            /* evaluate '..' */
            if (!(options & LYXP_SKIP_EXPR)) {
                if (((options & LYXP_SCNODE_ALL) && (set->type != LYXP_SET_SCNODE_SET)) ||
                        (!(options & LYXP_SCNODE_ALL) && (set->type != LYXP_SET_NODE_SET))) {
                    LOGVAL(set->ctx, LY_VCODE_XP_INOP_1, "path operator", print_set_type(set));
                    rc = LY_EVALID;
                    goto cleanup;
                }

                if (all_desc) {
                    rc = xpath_pi_node(set, LYXP_AXIS_DESCENDANT_OR_SELF, options);
                    LY_CHECK_GOTO(rc, cleanup);
                }
                rc = xpath_pi_node(set, LYXP_AXIS_PARENT, options);
                LY_CHECK_GOTO(rc, cleanup);
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);
            break;

        case LYXP_TOKEN_NAMETEST:
            /* evaluate NameTest Predicate* */
            rc = eval_name_test_with_predicate(exp, tok_idx, axis, all_desc, set, options);
            if (rc == LY_ENOT) {
                assert(options & LYXP_SCNODE_ALL);
                rc = LY_SUCCESS;

                /* skip the rest of this path */
                scnode_skip_path = 1;
                options |= LYXP_SKIP_EXPR;
            }
            LY_CHECK_GOTO(rc, cleanup);
            break;

        case LYXP_TOKEN_NODETYPE:
            /* evaluate NodeType Predicate* */
            rc = eval_node_type_with_predicate(exp, tok_idx, axis, all_desc, set, options);
            LY_CHECK_GOTO(rc, cleanup);
            break;

        default:
            LOGINT(set->ctx);
            rc = LY_EINT;
            goto cleanup;
        }
    } while (!exp_check_token2(NULL, exp, *tok_idx, LYXP_TOKEN_OPER_PATH, LYXP_TOKEN_OPER_RPATH));

cleanup:
    if (scnode_skip_path) {
        options &= ~LYXP_SKIP_EXPR;
    }
    return rc;
}